

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

_Bool roaring64_iterator_advance(roaring64_iterator_t *it)

{
  art_val_t *paVar1;
  _Bool _Var2;
  uint16_t low16;
  
  paVar1 = (it->art_it).value;
  if (paVar1 == (art_val_t *)0x0) {
    if (it->saturated_forward != true) {
      roaring64_iterator_init_at(it->parent,it,true);
      return it->has_value;
    }
    it->has_value = false;
LAB_001077ea:
    _Var2 = false;
  }
  else {
    low16 = (uint16_t)it->value;
    _Var2 = container_iterator_next
                      (*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],&it->container_it,
                       &low16);
    if (_Var2) {
      it->value = (ulong)low16 | it->high48;
      it->has_value = true;
    }
    else {
      _Var2 = art_iterator_next(&it->art_it);
      if (!_Var2) {
        it->has_value = false;
        it->saturated_forward = true;
        goto LAB_001077ea;
      }
      roaring64_iterator_init_at_leaf_first(it);
    }
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool roaring64_iterator_advance(roaring64_iterator_t *it) {
    if (it->art_it.value == NULL) {
        if (it->saturated_forward) {
            return (it->has_value = false);
        }
        roaring64_iterator_init_at(it->parent, it, /*first=*/true);
        return it->has_value;
    }
    leaf_t *leaf = (leaf_t *)it->art_it.value;
    uint16_t low16 = (uint16_t)it->value;
    if (container_iterator_next(leaf->container, leaf->typecode,
                                &it->container_it, &low16)) {
        it->value = it->high48 | low16;
        return (it->has_value = true);
    }
    if (art_iterator_next(&it->art_it)) {
        return roaring64_iterator_init_at_leaf_first(it);
    }
    it->saturated_forward = true;
    return (it->has_value = false);
}